

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_make_params
              (mbedtls_ecdh_context *ctx,size_t *olen,uchar *buf,size_t blen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  size_t local_58;
  size_t pt_len;
  size_t grp_len;
  void *pvStack_40;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  size_t blen_local;
  uchar *buf_local;
  size_t *olen_local;
  mbedtls_ecdh_context *ctx_local;
  
  if ((ctx == (mbedtls_ecdh_context *)0x0) || ((ctx->grp).pbits == 0)) {
    ctx_local._4_4_ = -0x4f80;
  }
  else {
    pvStack_40 = p_rng;
    p_rng_local = f_rng;
    f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)blen;
    blen_local = (size_t)buf;
    buf_local = (uchar *)olen;
    olen_local = (size_t *)ctx;
    grp_len._4_4_ = mbedtls_ecdh_gen_public(&ctx->grp,&ctx->d,&ctx->Q,f_rng,p_rng);
    ctx_local._4_4_ = grp_len._4_4_;
    if ((grp_len._4_4_ == 0) &&
       (grp_len._4_4_ =
             mbedtls_ecp_tls_write_group
                       ((mbedtls_ecp_group *)olen_local,&pt_len,(uchar *)blen_local,
                        (size_t)f_rng_local), ctx_local._4_4_ = grp_len._4_4_, grp_len._4_4_ == 0))
    {
      blen_local = pt_len + blen_local;
      f_rng_local = f_rng_local + -pt_len;
      ctx_local._4_4_ =
           mbedtls_ecp_tls_write_point
                     ((mbedtls_ecp_group *)olen_local,(mbedtls_ecp_point *)(olen_local + 0x22),
                      (int)olen_local[0x37],&local_58,(uchar *)blen_local,(size_t)f_rng_local);
      if (ctx_local._4_4_ == 0) {
        *(size_t *)buf_local = pt_len + local_58;
        ctx_local._4_4_ = 0;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_make_params( mbedtls_ecdh_context *ctx, size_t *olen,
                      unsigned char *buf, size_t blen,
                      int (*f_rng)(void *, unsigned char *, size_t),
                      void *p_rng )
{
    int ret;
    size_t grp_len, pt_len;

    if( ctx == NULL || ctx->grp.pbits == 0 )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecdh_gen_public( &ctx->grp, &ctx->d, &ctx->Q, f_rng, p_rng ) )
                != 0 )
        return( ret );

    if( ( ret = mbedtls_ecp_tls_write_group( &ctx->grp, &grp_len, buf, blen ) )
                != 0 )
        return( ret );

    buf += grp_len;
    blen -= grp_len;

    if( ( ret = mbedtls_ecp_tls_write_point( &ctx->grp, &ctx->Q, ctx->point_format,
                                     &pt_len, buf, blen ) ) != 0 )
        return( ret );

    *olen = grp_len + pt_len;
    return( 0 );
}